

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O0

void Aig_ManSupportNodes_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Int_t *vSupport)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Vec_Int_t *vSupport_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Aig_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Aig_ObjIsCi(pObj);
    if (iVar1 == 0) {
      pAVar2 = Aig_ObjFanin0(pObj);
      Aig_ManSupportNodes_rec(p,pAVar2,vSupport);
      pAVar2 = Aig_ObjFanin1(pObj);
      Aig_ManSupportNodes_rec(p,pAVar2,vSupport);
    }
    else {
      iVar1 = Aig_ObjCioId(pObj);
      Vec_IntPush(vSupport,iVar1);
    }
  }
  return;
}

Assistant:

void Aig_ManSupportNodes_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Int_t * vSupport )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsCi(pObj) )
    {
        Vec_IntPush( vSupport, Aig_ObjCioId(pObj) );
        return;
    }
    Aig_ManSupportNodes_rec( p, Aig_ObjFanin0(pObj), vSupport );
    Aig_ManSupportNodes_rec( p, Aig_ObjFanin1(pObj), vSupport );
}